

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O2

void __thiscall serial::Serial::SerialImpl::writeUnlock(SerialImpl *this)

{
  IOException *this_00;
  int errnum;
  allocator<char> local_41;
  string local_40;
  
  errnum = pthread_mutex_unlock((pthread_mutex_t *)&this->write_mutex);
  if (errnum == 0) {
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
             ,&local_41);
  IOException::IOException(this_00,&local_40,0x426,errnum);
  __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void
Serial::SerialImpl::writeUnlock ()
{
  int result = pthread_mutex_unlock(&this->write_mutex);
  if (result) {
    THROW (IOException, result);
  }
}